

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

string * testing::internal::DefaultParamName<bool>
                   (string *__return_storage_ptr__,TestParamInfo<bool> *info)

{
  ulong __val;
  bool bVar1;
  char cVar2;
  ulong uVar3;
  string *__str;
  char cVar4;
  
  __val = info->index;
  cVar4 = '\x01';
  if (9 < __val) {
    uVar3 = __val;
    cVar2 = '\x04';
    do {
      cVar4 = cVar2;
      if (uVar3 < 100) {
        cVar4 = cVar4 + -2;
        goto LAB_0020ee36;
      }
      if (uVar3 < 1000) {
        cVar4 = cVar4 + -1;
        goto LAB_0020ee36;
      }
      if (uVar3 < 10000) goto LAB_0020ee36;
      bVar1 = 99999 < uVar3;
      uVar3 = uVar3 / 10000;
      cVar2 = cVar4 + '\x04';
    } while (bVar1);
    cVar4 = cVar4 + '\x01';
  }
LAB_0020ee36:
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,cVar4);
  std::__detail::__to_chars_10_impl<unsigned_long>
            ((__return_storage_ptr__->_M_dataplus)._M_p,
             (uint)__return_storage_ptr__->_M_string_length,__val);
  return __return_storage_ptr__;
}

Assistant:

std::string DefaultParamName(const TestParamInfo<ParamType>& info) {
  return std::to_string(info.index);
}